

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

bool __thiscall ThreadPool::empty(ThreadPool *this)

{
  byte bVar1;
  long in_RDI;
  bool emp;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  std::mutex::lock((mutex *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  bVar1 = std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::empty
                    ((list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *)
                     (in_RDI + 0xe8));
  std::mutex::unlock((mutex *)0x13c054);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ThreadPool::empty()
{
    _taskInfo.lock();

    const bool emp = _task.empty();

    _taskInfo.unlock();

    return emp;
}